

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

Expression * __thiscall
wasm::SafeHeap::makeBoundsCheck
          (SafeHeap *this,Type type,Builder *builder,Index ptrLocal,Index sumLocal,Index bytes,
          Module *module,Type addressType,bool is64,Name memory)

{
  Name target;
  Name target_00;
  initializer_list<wasm::Expression_*> __l;
  Name target_01;
  BinaryOp op;
  Builder *pBVar1;
  Builder *this_00;
  bool bVar2;
  uint bytes_00;
  BinaryOp BVar3;
  PassOptions *pPVar4;
  LocalGet *pLVar5;
  Const *pCVar6;
  Binary *pBVar7;
  LocalGet *right;
  Binary *right_00;
  Call *left;
  Expression *right_01;
  Block *ifTrue;
  If *pIVar8;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  BinaryOp local_204;
  undefined1 local_1e8 [2] [12];
  undefined1 local_1d0 [12];
  Type local_1c0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_1b8;
  size_t local_198;
  char *pcStack_190;
  SafeHeap *local_188;
  SafeHeap *local_180;
  Binary *local_178;
  Binary *overflowCheck;
  SafeHeap *local_168;
  Binary *local_160;
  Binary *lowerCheck;
  SafeHeap *local_150;
  Binary *local_148;
  Binary *upperCheck;
  BinaryOp addOp;
  BinaryOp gtuOp;
  char *local_130;
  SafeHeap *local_128;
  Address local_120;
  uint local_114;
  SafeHeap *pSStack_110;
  int size;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_108;
  size_t local_e8;
  char *pcStack_e0;
  SafeHeap *local_d0;
  size_t local_c8;
  char *local_c0;
  Call *local_b8;
  Expression *sbrkPtr;
  allocator<wasm::Expression_*> local_91;
  SafeHeap *local_90;
  Const *local_88;
  Const **local_80;
  size_type local_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_70;
  size_t local_58;
  char *pcStack_50;
  Load *local_48;
  Expression *brkLocation;
  int upperBound;
  BinaryOp upperOp;
  bool lowMemUnused;
  Index IStack_30;
  bool is64_local;
  Index bytes_local;
  Index sumLocal_local;
  Index ptrLocal_local;
  Builder *builder_local;
  SafeHeap *this_local;
  Type addressType_local;
  Type type_local;
  
  this_local = (SafeHeap *)addressType.id;
  upperBound._3_1_ = is64;
  upperOp = bytes;
  IStack_30 = sumLocal;
  bytes_local = ptrLocal;
  _sumLocal_local = builder;
  builder_local = (Builder *)this;
  addressType_local = type;
  pPVar4 = Pass::getPassOptions(&this->super_Pass);
  upperBound._2_1_ = pPVar4->lowMemoryUnused & 1;
  if ((upperBound._3_1_ & 1) == 0) {
    local_204 = EqInt32;
    if (upperBound._2_1_ != 0) {
      local_204 = LtUInt32;
    }
  }
  else {
    local_204 = EqInt64;
    if (upperBound._2_1_ != 0) {
      local_204 = LtUInt64;
    }
  }
  brkLocation._4_4_ = local_204;
  brkLocation._0_4_ = 0;
  if (upperBound._2_1_ != 0) {
    brkLocation._0_4_ = 0x400;
  }
  bVar2 = IString::is(&(this->sbrk).super_IString);
  pBVar1 = _sumLocal_local;
  if (bVar2) {
    local_58 = (this->sbrk).super_IString.str._M_len;
    pcStack_50 = (this->sbrk).super_IString.str._M_str;
    local_90 = this_local;
    local_88 = Builder::makeConstPtr(_sumLocal_local,0,(Type)this_local);
    local_80 = &local_88;
    local_78 = 1;
    std::allocator<wasm::Expression_*>::allocator(&local_91);
    __l._M_len = local_78;
    __l._M_array = (iterator)local_80;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_70,__l,&local_91);
    sbrkPtr = (Expression *)this_local;
    target_01.super_IString.str._M_str = pcStack_50;
    target_01.super_IString.str._M_len = local_58;
    local_48 = (Load *)Builder::makeCall(pBVar1,target_01,&local_70,(Type)this_local,false);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_70);
    std::allocator<wasm::Expression_*>::~allocator(&local_91);
  }
  else {
    bVar2 = IString::is(&(this->dynamicTopPtr).super_IString);
    pBVar1 = _sumLocal_local;
    if (bVar2) {
      local_c8 = (this->dynamicTopPtr).super_IString.str._M_len;
      local_c0 = (this->dynamicTopPtr).super_IString.str._M_str;
      local_d0 = this_local;
      local_b8 = (Call *)Builder::makeGlobalGet
                                   (_sumLocal_local,(Name)(this->dynamicTopPtr).super_IString.str,
                                    (Type)this_local);
    }
    else {
      local_e8 = (this->getSbrkPtr).super_IString.str._M_len;
      pcStack_e0 = (this->getSbrkPtr).super_IString.str._M_str;
      local_108.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_108);
      pSStack_110 = this_local;
      target_00.super_IString.str._M_str = pcStack_e0;
      target_00.super_IString.str._M_len = local_e8;
      local_b8 = Builder::makeCall(pBVar1,target_00,&local_108,(Type)this_local,false);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_108);
    }
    pBVar1 = _sumLocal_local;
    bytes_00 = 4;
    if ((upperBound._3_1_ & 1) != 0) {
      bytes_00 = 8;
    }
    local_114 = bytes_00;
    wasm::Address::Address(&local_120,0);
    local_128 = this_local;
    _addOp = memory.super_IString.str._M_len;
    local_130 = memory.super_IString.str._M_str;
    local_48 = Builder::makeLoad(pBVar1,bytes_00,false,local_120,local_114,(Expression *)local_b8,
                                 (Type)this_local,memory);
  }
  pBVar1 = _sumLocal_local;
  BVar3 = brkLocation._4_4_;
  upperCheck._4_4_ = GtUInt32;
  if ((upperBound._3_1_ & 1) != 0) {
    upperCheck._4_4_ = GtUInt64;
  }
  upperCheck._0_4_ = AddInt32;
  if ((upperBound._3_1_ & 1) != 0) {
    upperCheck._0_4_ = AddInt64;
  }
  local_150 = this_local;
  pLVar5 = Builder::makeLocalGet(_sumLocal_local,IStack_30,(Type)this_local);
  lowerCheck = (Binary *)this_local;
  pCVar6 = Builder::makeConstPtr(_sumLocal_local,(long)(int)brkLocation,(Type)this_local);
  local_148 = Builder::makeBinary(pBVar1,BVar3,(Expression *)pLVar5,(Expression *)pCVar6);
  pBVar1 = _sumLocal_local;
  op = upperCheck._4_4_;
  BVar3 = (BinaryOp)upperCheck;
  local_168 = this_local;
  pLVar5 = Builder::makeLocalGet(_sumLocal_local,IStack_30,(Type)this_local);
  overflowCheck = (Binary *)this_local;
  pCVar6 = Builder::makeConstPtr(_sumLocal_local,(ulong)upperOp,(Type)this_local);
  pBVar7 = Builder::makeBinary(pBVar1,BVar3,(Expression *)pLVar5,(Expression *)pCVar6);
  local_160 = Builder::makeBinary(pBVar1,op,(Expression *)pBVar7,(Expression *)local_48);
  pBVar1 = _sumLocal_local;
  BVar3 = LtUInt32;
  if ((upperBound._3_1_ & 1) != 0) {
    BVar3 = LtUInt64;
  }
  local_180 = this_local;
  pLVar5 = Builder::makeLocalGet(_sumLocal_local,IStack_30,(Type)this_local);
  local_188 = this_local;
  right = Builder::makeLocalGet(_sumLocal_local,bytes_local,(Type)this_local);
  local_178 = Builder::makeBinary(pBVar1,BVar3,(Expression *)pLVar5,(Expression *)right);
  pBVar1 = _sumLocal_local;
  pBVar7 = local_148;
  right_00 = Builder::makeBinary(_sumLocal_local,OrInt32,(Expression *)local_160,
                                 (Expression *)local_178);
  pBVar7 = Builder::makeBinary(pBVar1,OrInt32,(Expression *)pBVar7,(Expression *)right_00);
  this_00 = _sumLocal_local;
  local_198 = (this->segfault).super_IString.str._M_len;
  pcStack_190 = (this->segfault).super_IString.str._M_str;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_1b8);
  wasm::Type::Type(&local_1c0,none);
  target.super_IString.str._M_str = pcStack_190;
  target.super_IString.str._M_len = local_198;
  left = Builder::makeCall(this_00,target,&local_1b8,local_1c0,false);
  right_01 = (Expression *)Builder::makeUnreachable(_sumLocal_local);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1d0);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_1d0._0_8_;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1d0[8];
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_1d0._9_3_;
  ifTrue = Builder::makeSequence(this_00,(Expression *)left,right_01,type_01);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1e8);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)local_1e8[0]._0_8_;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1e8[0][8];
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_1e8[0]._9_3_;
  pIVar8 = Builder::makeIf(pBVar1,(Expression *)pBVar7,(Expression *)ifTrue,(Expression *)0x0,
                           type_00);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_1b8);
  return (Expression *)pIVar8;
}

Assistant:

Expression* makeBoundsCheck(Type type,
                              Builder& builder,
                              Index ptrLocal,
                              Index sumLocal,
                              Index bytes,
                              Module* module,
                              Type addressType,
                              bool is64,
                              Name memory) {
    bool lowMemUnused = getPassOptions().lowMemoryUnused;
    auto upperOp = is64 ? lowMemUnused ? LtUInt64 : EqInt64
                        : lowMemUnused ? LtUInt32 : EqInt32;
    auto upperBound = lowMemUnused ? PassOptions::LowMemoryBound : 0;
    Expression* brkLocation;
    if (sbrk.is()) {
      brkLocation = builder.makeCall(
        sbrk, {builder.makeConstPtr(0, addressType)}, addressType);
    } else {
      Expression* sbrkPtr;
      if (dynamicTopPtr.is()) {
        sbrkPtr = builder.makeGlobalGet(dynamicTopPtr, addressType);
      } else {
        sbrkPtr = builder.makeCall(getSbrkPtr, {}, addressType);
      }
      auto size = is64 ? 8 : 4;
      brkLocation =
        builder.makeLoad(size, false, 0, size, sbrkPtr, addressType, memory);
    }
    auto gtuOp = is64 ? GtUInt64 : GtUInt32;
    auto addOp = is64 ? AddInt64 : AddInt32;
    auto* upperCheck =
      builder.makeBinary(upperOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(upperBound, addressType));
    auto* lowerCheck = builder.makeBinary(
      gtuOp,
      builder.makeBinary(addOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(bytes, addressType)),
      brkLocation);
    // Check for an overflow when adding the pointer and the size, using the
    // rule that for any unsigned x and y,
    //    x + y < x    <=>   x + y overflows
    auto* overflowCheck =
      builder.makeBinary(is64 ? LtUInt64 : LtUInt32,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeLocalGet(ptrLocal, addressType));
    // Add an unreachable right after the call to segfault for performance
    // reasons: the call never returns, and this helps optimizations benefit
    // from that.
    return builder.makeIf(
      builder.makeBinary(
        OrInt32,
        upperCheck,
        builder.makeBinary(OrInt32, lowerCheck, overflowCheck)),
      builder.makeSequence(builder.makeCall(segfault, {}, Type::none),
                           builder.makeUnreachable()));
  }